

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Socket.cpp
# Opt level: O2

void __thiscall AGSSock::AGSSocket::Unserialize(AGSSocket *this)

{
  undefined4 *puVar1;
  undefined8 uVar2;
  int in_ECX;
  void *in_RDX;
  undefined4 in_ESI;
  ulong uVar3;
  size_t __n;
  undefined4 uStack_78;
  undefined4 uStack_74;
  undefined4 uStack_70;
  undefined4 uStack_6c;
  undefined4 uStack_68;
  undefined4 uStack_64;
  undefined1 *puStack_60;
  undefined8 uStack_58;
  undefined1 auStack_50 [16];
  undefined1 *apuStack_40 [2];
  undefined1 auStack_30 [16];
  
  uVar3 = (ulong)in_ECX;
  __n = 0x18;
  if (uVar3 < 0x18) {
    __n = uVar3;
  }
  memcpy(&uStack_78,in_RDX,__n);
  puStack_60 = auStack_50;
  uStack_58 = 0;
  auStack_50[0] = 0;
  if ((int)__n < in_ECX) {
    apuStack_40[0] = auStack_30;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)apuStack_40,__n + (long)in_RDX,uVar3 + (long)in_RDX);
    std::__cxx11::string::operator=((string *)&puStack_60,(string *)apuStack_40);
    std::__cxx11::string::~string((string *)apuStack_40);
  }
  puVar1 = (undefined4 *)operator_new(0xa0);
  *puVar1 = 0xffffffff;
  puVar1[1] = uStack_78;
  puVar1[2] = uStack_74;
  puVar1[3] = uStack_70;
  puVar1[4] = uStack_6c;
  uVar2 = (**(code **)(*AGSSockAPI::engine + 0x238))(AGSSockAPI::engine,uStack_68);
  *(undefined8 *)(puVar1 + 6) = uVar2;
  uVar2 = (**(code **)(*AGSSockAPI::engine + 0x238))(AGSSockAPI::engine,uStack_64);
  *(undefined8 *)(puVar1 + 8) = uVar2;
  std::__cxx11::string::string((string *)(puVar1 + 10),(string *)&puStack_60);
  Buffer::Buffer((Buffer *)(puVar1 + 0x12));
  (**(code **)(*AGSSockAPI::engine + 0x230))(AGSSockAPI::engine,in_ESI,puVar1,&agsSocket);
  std::__cxx11::string::~string((string *)&puStack_60);
  return;
}

Assistant:

void AGSSocket::Unserialize(int key, const char *buffer, int length)
{
	AGSSocketSerial serial;
	int size = MIN(length, sizeof (AGSSocketSerial));
	memcpy(&serial, buffer, size);

	string tag;
	if (length - size > 0)
		tag = string(buffer + size, (size_t) length - size);
	
	Socket *sock = new Socket
	{
		INVALID_SOCKET,
		serial.domain, serial.type, serial.protocol,
		serial.error,
		AGS_FROM_KEY(SockAddr, serial.local),
		AGS_FROM_KEY(SockAddr, serial.remote),
		tag
	};
	
	AGS_RESTORE(Socket, sock, key);
}